

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O3

Node * __thiscall p2t::Sweep::PointEvent(Sweep *this,SweepContext *tcx,Point *point)

{
  Node *node;
  Node *n;
  
  node = SweepContext::LocateNode(tcx,point);
  n = NewFrontTriangle(this,tcx,point,node);
  if (point->x <= node->point->x + 1e-12) {
    Fill(this,tcx,node);
  }
  FillAdvancingFront(this,tcx,n);
  return n;
}

Assistant:

Node& Sweep::PointEvent(SweepContext& tcx, Point& point)
{
  Node& node = tcx.LocateNode(point);
  Node& new_node = NewFrontTriangle(tcx, point, node);

  // Only need to check +epsilon since point never have smaller
  // x value than node due to how we fetch nodes from the front
  if (point.x <= node.point->x + EPSILON) {
    Fill(tcx, node);
  }

  //tcx.AddNode(new_node);

  FillAdvancingFront(tcx, new_node);
  return new_node;
}